

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslserver_p.h
# Opt level: O1

void __thiscall QSslServerPrivate::SocketData::disconnectSignals(SocketData *this)

{
  long in_FS_OFFSET;
  Connection __old_val;
  Connection local_40;
  Connection local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QMetaObject::Connection::Connection(&local_40);
  local_38.d_ptr = (this->readyReadConnection).d_ptr;
  (this->readyReadConnection).d_ptr = (void *)0x0;
  (this->readyReadConnection).d_ptr = local_40.d_ptr;
  local_40.d_ptr = (void *)0x0;
  QObject::disconnect(&local_38);
  QMetaObject::Connection::~Connection(&local_38);
  QMetaObject::Connection::~Connection(&local_40);
  QMetaObject::Connection::Connection(&local_40);
  local_38.d_ptr = (this->destroyedConnection).d_ptr;
  (this->destroyedConnection).d_ptr = (void *)0x0;
  (this->destroyedConnection).d_ptr = local_40.d_ptr;
  local_40.d_ptr = (void *)0x0;
  QObject::disconnect(&local_38);
  QMetaObject::Connection::~Connection(&local_38);
  QMetaObject::Connection::~Connection(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void disconnectSignals()
        {
            QObject::disconnect(std::exchange(readyReadConnection, {}));
            QObject::disconnect(std::exchange(destroyedConnection, {}));
        }